

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall TxConfirmStats::resizeInMemoryCounters(TxConfirmStats *this,size_t newbuckets)

{
  long lVar1;
  long lVar2;
  pointer pvVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->unconfTxs,
           (ulong)((int)((ulong)((long)(this->confAvg).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->confAvg).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * this->scale
                  * -0x55555555));
  pvVar3 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->unconfTxs).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      std::vector<int,_std::allocator<int>_>::resize(pvVar3 + uVar4,newbuckets);
      pvVar3 = (this->unconfTxs).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->unconfTxs).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
      bVar6 = uVar5 <= uVar4;
      lVar2 = uVar4 - uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::vector<int,_std::allocator<int>_>::resize(&this->oldUnconfTxs,newbuckets);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::resizeInMemoryCounters(size_t newbuckets) {
    // newbuckets must be passed in because the buckets referred to during Read have not been updated yet.
    unconfTxs.resize(GetMaxConfirms());
    for (unsigned int i = 0; i < unconfTxs.size(); i++) {
        unconfTxs[i].resize(newbuckets);
    }
    oldUnconfTxs.resize(newbuckets);
}